

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

void handleSelection(char type,int selection)

{
  ostream *poVar1;
  allocator<char> local_541;
  string local_540;
  allocator<char> local_519;
  string local_518;
  allocator<char> local_4f1;
  string local_4f0;
  allocator<char> local_4c9;
  string local_4c8;
  allocator<char> local_4a1;
  string local_4a0;
  allocator<char> local_479;
  string local_478;
  allocator<char> local_451;
  string local_450;
  allocator<char> local_429;
  string local_428;
  allocator<char> local_401;
  string local_400;
  allocator<char> local_3d9;
  string local_3d8;
  allocator<char> local_3b1;
  string local_3b0;
  allocator<char> local_389;
  string local_388;
  allocator<char> local_361;
  string local_360;
  allocator<char> local_339;
  string local_338;
  allocator<char> local_311;
  string local_310;
  allocator<char> local_2e9;
  string local_2e8;
  allocator<char> local_2c1;
  string local_2c0;
  allocator<char> local_299;
  string local_298;
  allocator<char> local_271;
  string local_270;
  allocator<char> local_249;
  string local_248;
  allocator<char> local_221;
  string local_220;
  allocator<char> local_1f9;
  string local_1f8;
  allocator<char> local_1d1;
  string local_1d0;
  allocator<char> local_1a9;
  string local_1a8;
  allocator<char> local_181;
  string local_180;
  allocator<char> local_159;
  string local_158;
  allocator<char> local_131;
  string local_130;
  allocator<char> local_109;
  string local_108;
  allocator<char> local_e1;
  string local_e0;
  allocator<char> local_b9;
  string local_b8;
  allocator<char> local_91;
  string local_90;
  allocator<char> local_69;
  string local_68;
  allocator<char> local_31;
  string local_30;
  int local_10;
  char local_9;
  int selection_local;
  char type_local;
  
  local_10 = selection;
  local_9 = type;
  if ((type == 'D') || (type == 'd')) {
    switch(selection) {
    case 1:
      poVar1 = std::operator<<((ostream *)&std::cout,"/* #1 Removal of Trigraphs */");
      std::ostream::operator<<((ostream *)poVar1,std::endl<char,std::char_traits<char>>);
      poVar1 = std::operator<<((ostream *)&std::cout,
                               "Please see the source file located at ~/CPlusPlus17/src/old/1/trigraphs.cpp."
                              );
      std::ostream::operator<<((ostream *)poVar1,std::endl<char,std::char_traits<char>>);
      poVar1 = std::operator<<((ostream *)&std::cout,"Compile against -std=c++14 to build.");
      std::ostream::operator<<((ostream *)poVar1,std::endl<char,std::char_traits<char>>);
      break;
    case 2:
      poVar1 = std::operator<<((ostream *)&std::cout,
                               "/* #2 Removal of deprecated Increment Operator(++) for bool type */"
                              );
      std::ostream::operator<<((ostream *)poVar1,std::endl<char,std::char_traits<char>>);
      poVar1 = std::operator<<((ostream *)&std::cout,
                               "Please see the source file located at ~/CPlusPlus17/src/old/2/bool++_dep.cpp."
                              );
      std::ostream::operator<<((ostream *)poVar1,std::endl<char,std::char_traits<char>>);
      poVar1 = std::operator<<((ostream *)&std::cout,"Compile against -std=c++14 to build.");
      std::ostream::operator<<((ostream *)poVar1,std::endl<char,std::char_traits<char>>);
      break;
    case 3:
      poVar1 = std::operator<<((ostream *)&std::cout,
                               "/* #3 Removal of deprecated register keyword */");
      std::ostream::operator<<((ostream *)poVar1,std::endl<char,std::char_traits<char>>);
      poVar1 = std::operator<<((ostream *)&std::cout,
                               "Please see the source file located at ~/CPlusPlus17/src/old/3/register.cpp."
                              );
      std::ostream::operator<<((ostream *)poVar1,std::endl<char,std::char_traits<char>>);
      poVar1 = std::operator<<((ostream *)&std::cout,"Compile against -std=c++14 to build.");
      std::ostream::operator<<((ostream *)poVar1,std::endl<char,std::char_traits<char>>);
      break;
    case 4:
      poVar1 = std::operator<<((ostream *)&std::cout,
                               "/* #4 Removal of deprecated Dynamic Exception Specifications */");
      std::ostream::operator<<((ostream *)poVar1,std::endl<char,std::char_traits<char>>);
      poVar1 = std::operator<<((ostream *)&std::cout,
                               "Please see the source file located at ~/CPlusPlus17/src/old/4/dynam_except.cpp."
                              );
      std::ostream::operator<<((ostream *)poVar1,std::endl<char,std::char_traits<char>>);
      poVar1 = std::operator<<((ostream *)&std::cout,"Compile against -std=c++14 to build.");
      std::ostream::operator<<((ostream *)poVar1,std::endl<char,std::char_traits<char>>);
    }
  }
  else {
    switch(selection) {
    case 1:
      poVar1 = std::operator<<((ostream *)&std::cout,"/* #1 Addition of __has_include macro */");
      std::ostream::operator<<((ostream *)poVar1,std::endl<char,std::char_traits<char>>);
      poVar1 = std::operator<<((ostream *)&std::cout,
                               "The source file is located at ~/CPlusPlus17/src/new/1/hasinclude.cpp."
                              );
      std::ostream::operator<<((ostream *)poVar1,std::endl<char,std::char_traits<char>>);
      if ((isWindows & 1U) == 0) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_30,"new/1/hasinclude",&local_31);
        runNix(&local_30);
        std::__cxx11::string::~string((string *)&local_30);
        std::allocator<char>::~allocator(&local_31);
      }
      else {
        runWin32Process("new/1/hasinclude");
      }
      break;
    case 2:
      poVar1 = std::operator<<((ostream *)&std::cout,"/* #2 UTF 8 Character Literals */");
      std::ostream::operator<<((ostream *)poVar1,std::endl<char,std::char_traits<char>>);
      poVar1 = std::operator<<((ostream *)&std::cout,
                               "The source file is located at ~/CPlusPlus17/src/new/2/utf8.cpp.");
      std::ostream::operator<<((ostream *)poVar1,std::endl<char,std::char_traits<char>>);
      if ((isWindows & 1U) == 0) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_68,"new/2/utf8",&local_69);
        runNix(&local_68);
        std::__cxx11::string::~string((string *)&local_68);
        std::allocator<char>::~allocator(&local_69);
      }
      else {
        runWin32Process("new/2/utf8");
      }
      break;
    case 3:
      poVar1 = std::operator<<((ostream *)&std::cout,"/* #3 Hexadecimal Floating Point Literals */")
      ;
      std::ostream::operator<<((ostream *)poVar1,std::endl<char,std::char_traits<char>>);
      poVar1 = std::operator<<((ostream *)&std::cout,
                               "The source file is located at ~/CPlusPlus17/src/new/3/hex.cpp.");
      std::ostream::operator<<((ostream *)poVar1,std::endl<char,std::char_traits<char>>);
      if ((isWindows & 1U) == 0) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_90,"new/3/hex",&local_91);
        runNix(&local_90);
        std::__cxx11::string::~string((string *)&local_90);
        std::allocator<char>::~allocator(&local_91);
      }
      else {
        runWin32Process("new/3/hex");
      }
      break;
    case 4:
      poVar1 = std::operator<<((ostream *)&std::cout,
                               "/* #4 New rules for deduction of single member list using auto */");
      std::ostream::operator<<((ostream *)poVar1,std::endl<char,std::char_traits<char>>);
      poVar1 = std::operator<<((ostream *)&std::cout,
                               "The source file is located at ~/CPlusPlus17/src/new/4/auto_deduc.cpp."
                              );
      std::ostream::operator<<((ostream *)poVar1,std::endl<char,std::char_traits<char>>);
      if ((isWindows & 1U) == 0) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_b8,"new/4/auto_deduc",&local_b9);
        runNix(&local_b8);
        std::__cxx11::string::~string((string *)&local_b8);
        std::allocator<char>::~allocator(&local_b9);
      }
      else {
        runWin32Process("new/4/auto_deduc");
      }
      break;
    case 5:
      poVar1 = std::operator<<((ostream *)&std::cout,"/* #5 Update to __cplusplus value */");
      std::ostream::operator<<((ostream *)poVar1,std::endl<char,std::char_traits<char>>);
      poVar1 = std::operator<<((ostream *)&std::cout,
                               "The source file is located at ~/CPlusPlus17/src/new/5/cppvc.cpp.");
      std::ostream::operator<<((ostream *)poVar1,std::endl<char,std::char_traits<char>>);
      if ((isWindows & 1U) == 0) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_e0,"new/5/cppvc",&local_e1);
        runNix(&local_e0);
        std::__cxx11::string::~string((string *)&local_e0);
        std::allocator<char>::~allocator(&local_e1);
      }
      else {
        runWin32Process("new/5/cppvc");
      }
      break;
    case 6:
      poVar1 = std::operator<<((ostream *)&std::cout,"/* #6 Inline variables */");
      std::ostream::operator<<((ostream *)poVar1,std::endl<char,std::char_traits<char>>);
      poVar1 = std::operator<<((ostream *)&std::cout,
                               "The source file is located at ~/CPlusPlus17/src/new/6/inline.cpp.");
      std::ostream::operator<<((ostream *)poVar1,std::endl<char,std::char_traits<char>>);
      if ((isWindows & 1U) == 0) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_108,"new/6/inline",&local_109);
        runNix(&local_108);
        std::__cxx11::string::~string((string *)&local_108);
        std::allocator<char>::~allocator(&local_109);
      }
      else {
        runWin32Process("new/6/inline");
      }
      break;
    case 7:
      poVar1 = std::operator<<((ostream *)&std::cout,
                               "/* #7 New Syntax for Nested Namespace definitions */");
      std::ostream::operator<<((ostream *)poVar1,std::endl<char,std::char_traits<char>>);
      poVar1 = std::operator<<((ostream *)&std::cout,
                               "The source file is located at ~/CPlusPlus17/src/new/7/namespace.cpp."
                              );
      std::ostream::operator<<((ostream *)poVar1,std::endl<char,std::char_traits<char>>);
      if ((isWindows & 1U) == 0) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_130,"new/7/namespace",&local_131);
        runNix(&local_130);
        std::__cxx11::string::~string((string *)&local_130);
        std::allocator<char>::~allocator(&local_131);
      }
      else {
        runWin32Process("new/7/namespace");
      }
      break;
    case 8:
      poVar1 = std::operator<<((ostream *)&std::cout,
                               "/* #8  Initializers added to if/switch statements */");
      std::ostream::operator<<((ostream *)poVar1,std::endl<char,std::char_traits<char>>);
      poVar1 = std::operator<<((ostream *)&std::cout,
                               "The source file is located at ~/CPlusPlus17/src/new/8/init_if_sw.cpp."
                              );
      std::ostream::operator<<((ostream *)poVar1,std::endl<char,std::char_traits<char>>);
      if ((isWindows & 1U) == 0) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_158,"new/8/init_if_sw",&local_159);
        runNix(&local_158);
        std::__cxx11::string::~string((string *)&local_158);
        std::allocator<char>::~allocator(&local_159);
      }
      else {
        runWin32Process("new/8/init_if_sw");
      }
      break;
    case 9:
      poVar1 = std::operator<<((ostream *)&std::cout,"/* #9 constexpr if */");
      std::ostream::operator<<((ostream *)poVar1,std::endl<char,std::char_traits<char>>);
      poVar1 = std::operator<<((ostream *)&std::cout,
                               "The source file is located at ~/CPlusPlus17/src/new/9/constexpr_if.cpp."
                              );
      std::ostream::operator<<((ostream *)poVar1,std::endl<char,std::char_traits<char>>);
      if ((isWindows & 1U) == 0) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_180,"new/9/constexpr_if",&local_181);
        runNix(&local_180);
        std::__cxx11::string::~string((string *)&local_180);
        std::allocator<char>::~allocator(&local_181);
      }
      else {
        runWin32Process("new/9/constexpr_if");
      }
      break;
    case 10:
      poVar1 = std::operator<<((ostream *)&std::cout,
                               "/* #10 New standard attributes [[fallthrough]], [[maybe_unused]] & [[nodiscard]] */"
                              );
      std::ostream::operator<<((ostream *)poVar1,std::endl<char,std::char_traits<char>>);
      poVar1 = std::operator<<((ostream *)&std::cout,
                               "The source file is located at ~/CPlusPlus17/src/new/10/attributes.cpp."
                              );
      std::ostream::operator<<((ostream *)poVar1,std::endl<char,std::char_traits<char>>);
      if ((isWindows & 1U) == 0) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_1a8,"new/10/attributes",&local_1a9);
        runNix(&local_1a8);
        std::__cxx11::string::~string((string *)&local_1a8);
        std::allocator<char>::~allocator(&local_1a9);
      }
      else {
        runWin32Process("new/10/attributes");
      }
      break;
    case 0xb:
      poVar1 = std::operator<<((ostream *)&std::cout,
                               "/* #11 Attributes for Enumerator & Namespaces */");
      std::ostream::operator<<((ostream *)poVar1,std::endl<char,std::char_traits<char>>);
      poVar1 = std::operator<<((ostream *)&std::cout,
                               "The source file is located at ~/CPlusPlus17/src/new/11/attributes2.cpp."
                              );
      std::ostream::operator<<((ostream *)poVar1,std::endl<char,std::char_traits<char>>);
      if ((isWindows & 1U) == 0) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_1d0,"new/11/attributes2",&local_1d1);
        runNix(&local_1d0);
        std::__cxx11::string::~string((string *)&local_1d0);
        std::allocator<char>::~allocator(&local_1d1);
      }
      else {
        runWin32Process("new/11/attributes2");
      }
      break;
    case 0xc:
      poVar1 = std::operator<<((ostream *)&std::cout,
                               "/* #12 Error message for static_assert now optional */");
      std::ostream::operator<<((ostream *)poVar1,std::endl<char,std::char_traits<char>>);
      poVar1 = std::operator<<((ostream *)&std::cout,
                               "The source file is located at ~/CPlusPlus17/src/new/12/static_assert.cpp."
                              );
      std::ostream::operator<<((ostream *)poVar1,std::endl<char,std::char_traits<char>>);
      if ((isWindows & 1U) == 0) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_1f8,"new/12/static_assert",&local_1f9);
        runNix(&local_1f8);
        std::__cxx11::string::~string((string *)&local_1f8);
        std::allocator<char>::~allocator(&local_1f9);
      }
      else {
        runWin32Process("new/12/static_assert");
      }
      break;
    case 0xd:
      poVar1 = std::operator<<((ostream *)&std::cout,"/* #13 Structured binding declarations */");
      std::ostream::operator<<((ostream *)poVar1,std::endl<char,std::char_traits<char>>);
      poVar1 = std::operator<<((ostream *)&std::cout,
                               "The source file is located at ~/CPlusPlus17/src/new/13/tuple_pack.cpp."
                              );
      std::ostream::operator<<((ostream *)poVar1,std::endl<char,std::char_traits<char>>);
      if ((isWindows & 1U) == 0) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_220,"new/134/tuple_pack",&local_221);
        runNix(&local_220);
        std::__cxx11::string::~string((string *)&local_220);
        std::allocator<char>::~allocator(&local_221);
      }
      else {
        runWin32Process("new/13/tuple_pack");
      }
      break;
    case 0xe:
      poVar1 = std::operator<<((ostream *)&std::cout,anon_var_dwarf_2771);
      std::ostream::operator<<((ostream *)poVar1,std::endl<char,std::char_traits<char>>);
      poVar1 = std::operator<<((ostream *)&std::cout,
                               "The source file is located at ~/CPlusPlus17/src/new/14/templ_param.cpp."
                              );
      std::ostream::operator<<((ostream *)poVar1,std::endl<char,std::char_traits<char>>);
      if ((isWindows & 1U) == 0) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_248,"new/14/templ_param",&local_249);
        runNix(&local_248);
        std::__cxx11::string::~string((string *)&local_248);
        std::allocator<char>::~allocator(&local_249);
      }
      else {
        runWin32Process("new/14/templ_param");
      }
      break;
    case 0xf:
      poVar1 = std::operator<<((ostream *)&std::cout,
                               "/* #15 Constant evaluation for non-type template arguments */");
      std::ostream::operator<<((ostream *)poVar1,std::endl<char,std::char_traits<char>>);
      poVar1 = std::operator<<((ostream *)&std::cout,
                               "The source file is located at ~/CPlusPlus17/src/new/15/const_nontype.cpp."
                              );
      std::ostream::operator<<((ostream *)poVar1,std::endl<char,std::char_traits<char>>);
      if ((isWindows & 1U) == 0) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_270,"new/15/const_nontype",&local_271);
        runNix(&local_270);
        std::__cxx11::string::~string((string *)&local_270);
        std::allocator<char>::~allocator(&local_271);
      }
      else {
        runWin32Process("new/15/const_nontype");
      }
      break;
    case 0x10:
      poVar1 = std::operator<<((ostream *)&std::cout,"/* #16 Class template argument deduction */");
      std::ostream::operator<<((ostream *)poVar1,std::endl<char,std::char_traits<char>>);
      poVar1 = std::operator<<((ostream *)&std::cout,
                               "The source file is located at ~/CPlusPlus17/src/new/16/temp_arg_deduc.cpp."
                              );
      std::ostream::operator<<((ostream *)poVar1,std::endl<char,std::char_traits<char>>);
      if ((isWindows & 1U) == 0) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_298,"new/16/temp_arg_deduc",&local_299);
        runNix(&local_298);
        std::__cxx11::string::~string((string *)&local_298);
        std::allocator<char>::~allocator(&local_299);
      }
      else {
        runWin32Process("new/16/temp_arg_deduc");
      }
      break;
    case 0x11:
      poVar1 = std::operator<<((ostream *)&std::cout,
                               "/* #17 Extensions on over-aligned Memory Allocation */");
      std::ostream::operator<<((ostream *)poVar1,std::endl<char,std::char_traits<char>>);
      poVar1 = std::operator<<((ostream *)&std::cout,
                               "The source file is located at ~/CPlusPlus17/src/new/17/over_align.cpp."
                              );
      std::ostream::operator<<((ostream *)poVar1,std::endl<char,std::char_traits<char>>);
      if ((isWindows & 1U) == 0) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_2c0,"new/17/over_align",&local_2c1);
        runNix(&local_2c0);
        std::__cxx11::string::~string((string *)&local_2c0);
        std::allocator<char>::~allocator(&local_2c1);
      }
      else {
        runWin32Process("new/17/over_align");
      }
      break;
    case 0x12:
      poVar1 = std::operator<<((ostream *)&std::cout,"/* #18 Fold Expressions */");
      std::ostream::operator<<((ostream *)poVar1,std::endl<char,std::char_traits<char>>);
      poVar1 = std::operator<<((ostream *)&std::cout,
                               "The source file is located at ~/CPlusPlus17/src/new/18/fold_expr.cpp."
                              );
      std::ostream::operator<<((ostream *)poVar1,std::endl<char,std::char_traits<char>>);
      if ((isWindows & 1U) == 0) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_2e8,"new/18/fold_expr",&local_2e9);
        runNix(&local_2e8);
        std::__cxx11::string::~string((string *)&local_2e8);
        std::allocator<char>::~allocator(&local_2e9);
      }
      else {
        runWin32Process("new/18/fold_expr");
      }
      break;
    case 0x13:
      poVar1 = std::operator<<((ostream *)&std::cout,
                               "/* #19 List-style Initialization of Enumerations */");
      std::ostream::operator<<((ostream *)poVar1,std::endl<char,std::char_traits<char>>);
      poVar1 = std::operator<<((ostream *)&std::cout,
                               "The source file is located at ~/CPlusPlus17/src/new/19/enum_list.cpp."
                              );
      std::ostream::operator<<((ostream *)poVar1,std::endl<char,std::char_traits<char>>);
      if ((isWindows & 1U) == 0) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_310,"new/19/enum_list",&local_311);
        runNix(&local_310);
        std::__cxx11::string::~string((string *)&local_310);
        std::allocator<char>::~allocator(&local_311);
      }
      else {
        runWin32Process("new/19/enum_list");
      }
      break;
    case 0x14:
      poVar1 = std::operator<<((ostream *)&std::cout,
                               "/* #20 Specifying non-type template parameters with auto */");
      std::ostream::operator<<((ostream *)poVar1,std::endl<char,std::char_traits<char>>);
      poVar1 = std::operator<<((ostream *)&std::cout,
                               "The source file is located at ~/CPlusPlus17/src/new/20/auto_temp.cpp."
                              );
      std::ostream::operator<<((ostream *)poVar1,std::endl<char,std::char_traits<char>>);
      if ((isWindows & 1U) == 0) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_338,"new/20/auto_temp",&local_339);
        runNix(&local_338);
        std::__cxx11::string::~string((string *)&local_338);
        std::allocator<char>::~allocator(&local_339);
      }
      else {
        runWin32Process("new/20/auto_temp");
      }
      break;
    case 0x15:
      poVar1 = std::operator<<((ostream *)&std::cout,"/* #21  constexpr lambda expressions */");
      std::ostream::operator<<((ostream *)poVar1,std::endl<char,std::char_traits<char>>);
      poVar1 = std::operator<<((ostream *)&std::cout,
                               "The source file is located at ~/CPlusPlus17/src/new/21/constexpr_lambda.cpp."
                              );
      std::ostream::operator<<((ostream *)poVar1,std::endl<char,std::char_traits<char>>);
      if ((isWindows & 1U) == 0) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_360,"new/21/constexpr_lambda",&local_361);
        runNix(&local_360);
        std::__cxx11::string::~string((string *)&local_360);
        std::allocator<char>::~allocator(&local_361);
      }
      else {
        runWin32Process("new/21/constexpr_lambda");
      }
      break;
    case 0x16:
      poVar1 = std::operator<<((ostream *)&std::cout,"/* #22 Lambda this by value (*this) */");
      std::ostream::operator<<((ostream *)poVar1,std::endl<char,std::char_traits<char>>);
      poVar1 = std::operator<<((ostream *)&std::cout,
                               "The source file is located at ~/CPlusPlus17/src/new/22/lambda_this.cpp."
                              );
      std::ostream::operator<<((ostream *)poVar1,std::endl<char,std::char_traits<char>>);
      if ((isWindows & 1U) == 0) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_388,"new/22/lambda_this",&local_389);
        runNix(&local_388);
        std::__cxx11::string::~string((string *)&local_388);
        std::allocator<char>::~allocator(&local_389);
      }
      else {
        runWin32Process("new/22/lambda_this");
      }
      break;
    case 0x17:
      poVar1 = std::operator<<((ostream *)&std::cout,
                               "/* #23 Extending Aggregate Initialization to Base Types */");
      std::ostream::operator<<((ostream *)poVar1,std::endl<char,std::char_traits<char>>);
      poVar1 = std::operator<<((ostream *)&std::cout,
                               "The source file is located at ~/CPlusPlus17/src/new/23/aggregate.cpp."
                              );
      std::ostream::operator<<((ostream *)poVar1,std::endl<char,std::char_traits<char>>);
      if ((isWindows & 1U) == 0) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_3b0,"new/23/aggregate",&local_3b1);
        runNix(&local_3b0);
        std::__cxx11::string::~string((string *)&local_3b0);
        std::allocator<char>::~allocator(&local_3b1);
      }
      else {
        runWin32Process("new/23/aggregate");
      }
      break;
    case 0x18:
      poVar1 = std::operator<<((ostream *)&std::cout,
                               "/* #24 Unknown Attributes Required to be Ignored */");
      std::ostream::operator<<((ostream *)poVar1,std::endl<char,std::char_traits<char>>);
      poVar1 = std::operator<<((ostream *)&std::cout,
                               "The source file is located at ~/CPlusPlus17/src/new/24/unknw_attr.cpp."
                              );
      std::ostream::operator<<((ostream *)poVar1,std::endl<char,std::char_traits<char>>);
      if ((isWindows & 1U) == 0) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_3d8,"new/24/unknw_attr",&local_3d9);
        runNix(&local_3d8);
        std::__cxx11::string::~string((string *)&local_3d8);
        std::allocator<char>::~allocator(&local_3d9);
      }
      else {
        runWin32Process("new/24/unknw_attr");
      }
      break;
    case 0x19:
      poVar1 = std::operator<<((ostream *)&std::cout,
                               "/* #25 Pack Expansions legal in using declarations */");
      std::ostream::operator<<((ostream *)poVar1,std::endl<char,std::char_traits<char>>);
      poVar1 = std::operator<<((ostream *)&std::cout,
                               "The source file is located at ~/CPlusPlus17/src/new/25/using_pack.cpp."
                              );
      std::ostream::operator<<((ostream *)poVar1,std::endl<char,std::char_traits<char>>);
      if ((isWindows & 1U) == 0) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_400,"new/25/using_pack",&local_401);
        runNix(&local_400);
        std::__cxx11::string::~string((string *)&local_400);
        std::allocator<char>::~allocator(&local_401);
      }
      else {
        runWin32Process("new/25/using_pack");
      }
      break;
    case 0x1a:
      poVar1 = std::operator<<((ostream *)&std::cout,
                               "/* #26 Generalization of Range-based for loop */");
      std::ostream::operator<<((ostream *)poVar1,std::endl<char,std::char_traits<char>>);
      poVar1 = std::operator<<((ostream *)&std::cout,
                               "The source file is located at ~/CPlusPlus17/src/new/26/range_for.cpp."
                              );
      std::ostream::operator<<((ostream *)poVar1,std::endl<char,std::char_traits<char>>);
      if ((isWindows & 1U) == 0) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_428,"new/26/range_for",&local_429);
        runNix(&local_428);
        std::__cxx11::string::~string((string *)&local_428);
        std::allocator<char>::~allocator(&local_429);
      }
      else {
        runWin32Process("new/26/range_for");
      }
      break;
    case 0x1b:
      poVar1 = std::operator<<((ostream *)&std::cout,"/* #27 The byte data type */");
      std::ostream::operator<<((ostream *)poVar1,std::endl<char,std::char_traits<char>>);
      poVar1 = std::operator<<((ostream *)&std::cout,
                               "The source file is located at ~/CPlusPlus17/src/new/27/byte.cpp.");
      std::ostream::operator<<((ostream *)poVar1,std::endl<char,std::char_traits<char>>);
      if ((isWindows & 1U) == 0) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_450,"new/27/byte",&local_451);
        runNix(&local_450);
        std::__cxx11::string::~string((string *)&local_450);
        std::allocator<char>::~allocator(&local_451);
      }
      else {
        runWin32Process("new/27/byte");
      }
      break;
    case 0x1c:
      poVar1 = std::operator<<((ostream *)&std::cout,
                               "/* #28 Using attribute namespaces without repetition */");
      std::ostream::operator<<((ostream *)poVar1,std::endl<char,std::char_traits<char>>);
      poVar1 = std::operator<<((ostream *)&std::cout,
                               "The source file is located at ~/CPlusPlus17/src/new/28/using_attr.cpp."
                              );
      std::ostream::operator<<((ostream *)poVar1,std::endl<char,std::char_traits<char>>);
      if ((isWindows & 1U) == 0) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_478,"new/28/using_attr",&local_479);
        runNix(&local_478);
        std::__cxx11::string::~string((string *)&local_478);
        std::allocator<char>::~allocator(&local_479);
      }
      else {
        runWin32Process("new/28/using_attr");
      }
      break;
    case 0x1d:
      poVar1 = std::operator<<((ostream *)&std::cout,"/* #29 Stricter Order of Evaluation Rules */")
      ;
      std::ostream::operator<<((ostream *)poVar1,std::endl<char,std::char_traits<char>>);
      poVar1 = std::operator<<((ostream *)&std::cout,
                               "Please see the text file located at ~/CPlusPlus17/src/new/29/eval_order.txt."
                              );
      std::ostream::operator<<((ostream *)poVar1,std::endl<char,std::char_traits<char>>);
      if ((isWindows & 1U) == 0) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_4a0,"new/29/eval_order.txt",&local_4a1);
        runNix(&local_4a0);
        std::__cxx11::string::~string((string *)&local_4a0);
        std::allocator<char>::~allocator(&local_4a1);
      }
      else {
        runWin32Process("new/29/eval_order.txt");
      }
      break;
    case 0x1e:
      poVar1 = std::operator<<((ostream *)&std::cout,
                               "/* #30 Exception Specifications are part of type definitions */");
      std::ostream::operator<<((ostream *)poVar1,std::endl<char,std::char_traits<char>>);
      poVar1 = std::operator<<((ostream *)&std::cout,
                               "The source file is located at ~/CPlusPlus17/src/new/30/throw_type.cpp."
                              );
      std::ostream::operator<<((ostream *)poVar1,std::endl<char,std::char_traits<char>>);
      if ((isWindows & 1U) == 0) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_4c8,"new/30/throw_type",&local_4c9);
        runNix(&local_4c8);
        std::__cxx11::string::~string((string *)&local_4c8);
        std::allocator<char>::~allocator(&local_4c9);
      }
      else {
        runWin32Process("new/30/throw_type");
      }
      break;
    case 0x1f:
      poVar1 = std::operator<<((ostream *)&std::cout,
                               "/* #31 Template-Template Parameters match compatible arguments */");
      std::ostream::operator<<((ostream *)poVar1,std::endl<char,std::char_traits<char>>);
      poVar1 = std::operator<<((ostream *)&std::cout,
                               "The source file is located at ~/CPlusPlus17/src/new/31/templ_match.cpp."
                              );
      std::ostream::operator<<((ostream *)poVar1,std::endl<char,std::char_traits<char>>);
      if ((isWindows & 1U) == 0) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_4f0,"new/31/templ_match",&local_4f1);
        runNix(&local_4f0);
        std::__cxx11::string::~string((string *)&local_4f0);
        std::allocator<char>::~allocator(&local_4f1);
      }
      else {
        runWin32Process("new/31/templ_match");
      }
      break;
    case 0x20:
      poVar1 = std::operator<<((ostream *)&std::cout,"/* #31 Guaranteed Copy Elision */");
      std::ostream::operator<<((ostream *)poVar1,std::endl<char,std::char_traits<char>>);
      poVar1 = std::operator<<((ostream *)&std::cout,
                               "Please see the text file located at~/CPlusPlus17/src/new/32/templ_match.txt"
                              );
      std::ostream::operator<<((ostream *)poVar1,std::endl<char,std::char_traits<char>>);
      if ((isWindows & 1U) == 0) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_518,"new/32/templ_match.txt",&local_519);
        runNix(&local_518);
        std::__cxx11::string::~string((string *)&local_518);
        std::allocator<char>::~allocator(&local_519);
      }
      else {
        runWin32Process("new/32/templ_match.txt");
      }
      break;
    case 0x21:
      poVar1 = std::operator<<((ostream *)&std::cout,
                               "/* #33 Changes to Specification on Inheriting Constructors */");
      std::ostream::operator<<((ostream *)poVar1,std::endl<char,std::char_traits<char>>);
      poVar1 = std::operator<<((ostream *)&std::cout,
                               "Please see the text file located at~/CPlusPlus17/src/new/33/using_constr.cpp"
                              );
      std::ostream::operator<<((ostream *)poVar1,std::endl<char,std::char_traits<char>>);
      if ((isWindows & 1U) == 0) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_540,"new/33/using_constr",&local_541);
        runNix(&local_540);
        std::__cxx11::string::~string((string *)&local_540);
        std::allocator<char>::~allocator(&local_541);
      }
      else {
        runWin32Process("new/33/using_constr");
      }
    }
  }
  return;
}

Assistant:

void handleSelection (char type, int selection) {
	//Old Language Features
	if (type == 'D' || type == 'd' ){
		switch (selection) {
			case 1:
				cout << "/* #1 Removal of Trigraphs */" << endl;
				cout << "Please see the source file located at ~/CPlusPlus17/src/old/1/trigraphs.cpp." << endl;
				cout << "Compile against -std=c++14 to build." << endl;
				break;
			case 2:
				cout << "/* #2 Removal of deprecated Increment Operator(++) for bool type */" << endl;
				cout << "Please see the source file located at ~/CPlusPlus17/src/old/2/bool++_dep.cpp." << endl;
				cout << "Compile against -std=c++14 to build." << endl;
				break;
			case 3:
				cout << "/* #3 Removal of deprecated register keyword */" << endl;
				cout << "Please see the source file located at ~/CPlusPlus17/src/old/3/register.cpp." << endl;
				cout << "Compile against -std=c++14 to build." << endl;				
				break;
			case 4:
				cout << "/* #4 Removal of deprecated Dynamic Exception Specifications */" << endl;
				cout << "Please see the source file located at ~/CPlusPlus17/src/old/4/dynam_except.cpp." << endl;
				cout << "Compile against -std=c++14 to build." << endl;
				break;
		}
	}
	//New Language Features
	else {
		switch(selection){
			case 1:
				cout << "/* #1 Addition of __has_include macro */" << endl;
				cout << "The source file is located at ~/CPlusPlus17/src/new/1/hasinclude.cpp." << endl;
				if (isWindows)
					runWin32Process("new/1/hasinclude");
				else
					runNix("new/1/hasinclude");
				break;
			case 2:
				cout << "/* #2 UTF 8 Character Literals */" << endl;
				cout << "The source file is located at ~/CPlusPlus17/src/new/2/utf8.cpp." << endl;
				if (isWindows)
					runWin32Process("new/2/utf8");
				else
					runNix("new/2/utf8");
				break;
			case 3:
				cout << "/* #3 Hexadecimal Floating Point Literals */" << endl;
				cout << "The source file is located at ~/CPlusPlus17/src/new/3/hex.cpp." << endl;
				if (isWindows)
					runWin32Process("new/3/hex");
				else
					runNix("new/3/hex");
				break;
			case 4:
				cout << "/* #4 New rules for deduction of single member list using auto */" << endl;
				cout << "The source file is located at ~/CPlusPlus17/src/new/4/auto_deduc.cpp." << endl;
				if (isWindows)
					runWin32Process("new/4/auto_deduc");
				else
					runNix("new/4/auto_deduc");
				break;
			case 5:
				cout << "/* #5 Update to __cplusplus value */" << endl;
				cout << "The source file is located at ~/CPlusPlus17/src/new/5/cppvc.cpp." << endl;
				if (isWindows)
					runWin32Process("new/5/cppvc");
				else
					runNix("new/5/cppvc");
				break;
			case 6:
				cout << "/* #6 Inline variables */" << endl;
				cout << "The source file is located at ~/CPlusPlus17/src/new/6/inline.cpp." << endl;
				if (isWindows)
					runWin32Process("new/6/inline");
				else
					runNix("new/6/inline");
				break;
			case 7:
				cout << "/* #7 New Syntax for Nested Namespace definitions */" << endl;
				cout << "The source file is located at ~/CPlusPlus17/src/new/7/namespace.cpp." << endl;
				if (isWindows)
					runWin32Process("new/7/namespace");
				else
					runNix("new/7/namespace");
				break;
			case 8:
				cout << "/* #8  Initializers added to if/switch statements */" << endl;
				cout << "The source file is located at ~/CPlusPlus17/src/new/8/init_if_sw.cpp." << endl;
				if (isWindows)
					runWin32Process("new/8/init_if_sw");
				else
					runNix("new/8/init_if_sw");
				break;
			case 9:
				cout << "/* #9 constexpr if */" << endl;
				cout << "The source file is located at ~/CPlusPlus17/src/new/9/constexpr_if.cpp." << endl;
				if (isWindows)
					runWin32Process("new/9/constexpr_if");
				else
					runNix("new/9/constexpr_if");
				break;
			case 10:
				cout << "/* #10 New standard attributes [[fallthrough]], [[maybe_unused]] & [[nodiscard]] */" << endl;
				cout << "The source file is located at ~/CPlusPlus17/src/new/10/attributes.cpp." << endl;
				if (isWindows)
					runWin32Process("new/10/attributes");
				else
					runNix("new/10/attributes");
				break;
			case 11:
				cout << "/* #11 Attributes for Enumerator & Namespaces */"<< endl;
				cout << "The source file is located at ~/CPlusPlus17/src/new/11/attributes2.cpp." << endl;
				if (isWindows)
					runWin32Process("new/11/attributes2");
				else
					runNix("new/11/attributes2");
				break;
			case 12:
				cout << "/* #12 Error message for static_assert now optional */" << endl;
				cout << "The source file is located at ~/CPlusPlus17/src/new/12/static_assert.cpp." << endl;
				if (isWindows)
					runWin32Process("new/12/static_assert");
				else
					runNix("new/12/static_assert");
				break;
			case 13:
				cout << "/* #13 Structured binding declarations */" << endl;
				cout << "The source file is located at ~/CPlusPlus17/src/new/13/tuple_pack.cpp." << endl;
				if (isWindows)
					runWin32Process("new/13/tuple_pack");
				else
					runNix("new/134/tuple_pack");
				break;
			case 14:
				cout << "/* #14 Keyword typename now allowed in lieu of class in a template’s template paramater */" << endl;
				cout << "The source file is located at ~/CPlusPlus17/src/new/14/templ_param.cpp." << endl;
				if (isWindows)
					runWin32Process("new/14/templ_param");
				else
					runNix("new/14/templ_param");
				break;
			case 15:
				cout << "/* #15 Constant evaluation for non-type template arguments */" << endl;
				cout << "The source file is located at ~/CPlusPlus17/src/new/15/const_nontype.cpp." << endl;
				if (isWindows)
					runWin32Process("new/15/const_nontype");
				else
					runNix("new/15/const_nontype");
				break;
			case 16:
				cout << "/* #16 Class template argument deduction */" << endl;
				cout << "The source file is located at ~/CPlusPlus17/src/new/16/temp_arg_deduc.cpp." << endl;
				if (isWindows)
					runWin32Process("new/16/temp_arg_deduc");
				else
					runNix("new/16/temp_arg_deduc");
				break;
			case 17:
				cout << "/* #17 Extensions on over-aligned Memory Allocation */" << endl;
				cout << "The source file is located at ~/CPlusPlus17/src/new/17/over_align.cpp." << endl;
				if (isWindows)
					runWin32Process("new/17/over_align");
				else
					runNix("new/17/over_align");
				break;
			case 18:
				cout << "/* #18 Fold Expressions */" << endl;
				cout << "The source file is located at ~/CPlusPlus17/src/new/18/fold_expr.cpp." << endl;
				if (isWindows)
					runWin32Process("new/18/fold_expr");
				else
					runNix("new/18/fold_expr");
				break;
			case 19:
				cout << "/* #19 List-style Initialization of Enumerations */" << endl;
				cout << "The source file is located at ~/CPlusPlus17/src/new/19/enum_list.cpp." << endl;
				if (isWindows)
					runWin32Process("new/19/enum_list");
				else
					runNix("new/19/enum_list");
				break;
			case 20:
				cout << "/* #20 Specifying non-type template parameters with auto */" << endl;
				cout << "The source file is located at ~/CPlusPlus17/src/new/20/auto_temp.cpp." << endl;
				if (isWindows)
					runWin32Process("new/20/auto_temp");
				else
					runNix("new/20/auto_temp");
				break;
			case 21:
				cout << "/* #21  constexpr lambda expressions */" << endl;
				cout << "The source file is located at ~/CPlusPlus17/src/new/21/constexpr_lambda.cpp." << endl;
				if (isWindows)
					runWin32Process("new/21/constexpr_lambda");
				else
					runNix("new/21/constexpr_lambda");
				break;
			case 22:
				cout << "/* #22 Lambda this by value (*this) */" << endl;
				cout << "The source file is located at ~/CPlusPlus17/src/new/22/lambda_this.cpp." << endl;
				if (isWindows)
					runWin32Process("new/22/lambda_this");
				else
					runNix("new/22/lambda_this");
				break;
			case 23:
				cout << "/* #23 Extending Aggregate Initialization to Base Types */" << endl;
				cout << "The source file is located at ~/CPlusPlus17/src/new/23/aggregate.cpp." << endl;
				if (isWindows)
					runWin32Process("new/23/aggregate");
				else
					runNix("new/23/aggregate");
				break;
			case 24:
				cout << "/* #24 Unknown Attributes Required to be Ignored */" << endl;
				cout << "The source file is located at ~/CPlusPlus17/src/new/24/unknw_attr.cpp." << endl;
				if (isWindows)
					runWin32Process("new/24/unknw_attr");
				else
					runNix("new/24/unknw_attr");
				break;
			case 25:
				cout << "/* #25 Pack Expansions legal in using declarations */" << endl;
				cout << "The source file is located at ~/CPlusPlus17/src/new/25/using_pack.cpp." << endl;
				if (isWindows)
					runWin32Process("new/25/using_pack");
				else
					runNix("new/25/using_pack");
				break;
			case 26:
				cout << "/* #26 Generalization of Range-based for loop */" << endl;
				cout << "The source file is located at ~/CPlusPlus17/src/new/26/range_for.cpp." << endl;
				if (isWindows)
					runWin32Process("new/26/range_for");
				else
					runNix("new/26/range_for");
				break;
			case 27:
				cout << "/* #27 The byte data type */" << endl;
				cout << "The source file is located at ~/CPlusPlus17/src/new/27/byte.cpp." << endl;
				if (isWindows)
					runWin32Process("new/27/byte");
				else
					runNix("new/27/byte");
				break;
			case 28:
				cout << "/* #28 Using attribute namespaces without repetition */" << endl;
				cout << "The source file is located at ~/CPlusPlus17/src/new/28/using_attr.cpp." << endl;
				if (isWindows)
					runWin32Process("new/28/using_attr");
				else
					runNix("new/28/using_attr");
				break;
			case 29:
				cout << "/* #29 Stricter Order of Evaluation Rules */" << endl;
				cout << "Please see the text file located at ~/CPlusPlus17/src/new/29/eval_order.txt." << endl;
				if (isWindows)
					runWin32Process("new/29/eval_order.txt");
				else
					runNix("new/29/eval_order.txt");
				break;
			case 30:
				cout << "/* #30 Exception Specifications are part of type definitions */" << endl;
				cout << "The source file is located at ~/CPlusPlus17/src/new/30/throw_type.cpp." << endl;
				if (isWindows)
					runWin32Process("new/30/throw_type");
				else
					runNix("new/30/throw_type");
				break;
			case 31:
				cout << "/* #31 Template-Template Parameters match compatible arguments */" << endl;
				cout << "The source file is located at ~/CPlusPlus17/src/new/31/templ_match.cpp." << endl;
				if (isWindows)
					runWin32Process("new/31/templ_match");
				else
					runNix("new/31/templ_match");
				break;
			case 32:
				cout << "/* #31 Guaranteed Copy Elision */" << endl;
				cout << "Please see the text file located at~/CPlusPlus17/src/new/32/templ_match.txt" << endl;
				if (isWindows)
					runWin32Process("new/32/templ_match.txt");
				else
					runNix("new/32/templ_match.txt");
				break;
			case 33:
				cout << "/* #33 Changes to Specification on Inheriting Constructors */" << endl;
				cout << "Please see the text file located at~/CPlusPlus17/src/new/33/using_constr.cpp" << endl;
				if (isWindows)
					runWin32Process("new/33/using_constr");
				else
					runNix("new/33/using_constr");
				break;
		}
	}
}